

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void x86_64_farith2(dill_stream s,int b1,int typ,int dest,int src)

{
  uint insn2;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  int in_R8D;
  int rex1;
  int op;
  int rex;
  int insn4;
  int insn3;
  
  insn3 = 0xf3;
  insn2 = (uint)(7 < in_R8D);
  if (7 < in_ECX) {
    insn2 = insn2 | 4;
  }
  insn4 = 0;
  if (7 < in_ECX) {
    insn4 = 5;
  }
  BYTE_OUT3R((dill_stream)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,insn2,0xf3);
  if (in_EDX == 10) {
    insn3 = 0xf2;
  }
  BYTE_OUT1R3((dill_stream)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,insn2,insn3,insn4);
  return;
}

Assistant:

extern void
x86_64_farith2(dill_stream s, int b1, int typ, int dest, int src)
{
    /* this is fneg */
    int rex = 0;
    int op = 0xf3;
    if (src > XMM7)
        rex |= REX_B;
    if (dest > XMM7)
        rex |= REX_R;

    /* clear dest */
    {
        int rex1 = 0;
        if (dest > XMM7)
            rex1 = REX_R | REX_B;
        BYTE_OUT3R(s, rex1, 0x0f, 0x57,
                   ModRM(0x3, dest, dest));  // GSE really rex1?  Late fix.
    }
    if (typ == DILL_D)
        op = 0xf2;
    BYTE_OUT1R3(s, op, rex, 0x0f, 0x5c, ModRM(0x3, dest, src));
}